

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

void SetCost(uint32_t *histogram,size_t histogram_size,int literal_histogram,float *cost)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong local_78;
  size_t i;
  float missing_symbol_cost;
  float log2sum;
  size_t missing_symbol_sum;
  size_t sum;
  float *cost_local;
  int literal_histogram_local;
  size_t histogram_size_local;
  uint32_t *histogram_local;
  double local_30;
  double local_20;
  double local_10;
  
  missing_symbol_sum = 0;
  for (local_78 = 0; local_78 < histogram_size; local_78 = local_78 + 1) {
    missing_symbol_sum = histogram[local_78] + missing_symbol_sum;
  }
  if (missing_symbol_sum < 0x100) {
    local_10 = (double)kLog2Table[missing_symbol_sum];
  }
  else {
    auVar2._8_4_ = (int)(missing_symbol_sum >> 0x20);
    auVar2._0_8_ = missing_symbol_sum;
    auVar2._12_4_ = 0x45300000;
    local_10 = log2((auVar2._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)missing_symbol_sum) - 4503599627370496.0));
  }
  _missing_symbol_cost = missing_symbol_sum;
  if (literal_histogram == 0) {
    for (local_78 = 0; local_78 < histogram_size; local_78 = local_78 + 1) {
      if (histogram[local_78] == 0) {
        _missing_symbol_cost = _missing_symbol_cost + 1;
      }
    }
  }
  if (_missing_symbol_cost < 0x100) {
    local_20 = (double)kLog2Table[_missing_symbol_cost];
  }
  else {
    auVar3._8_4_ = (int)(_missing_symbol_cost >> 0x20);
    auVar3._0_8_ = _missing_symbol_cost;
    auVar3._12_4_ = 0x45300000;
    local_20 = log2((auVar3._8_8_ - 1.9342813113834067e+25) +
                    ((double)CONCAT44(0x43300000,(int)_missing_symbol_cost) - 4503599627370496.0));
  }
  for (local_78 = 0; local_78 < histogram_size; local_78 = local_78 + 1) {
    if (histogram[local_78] == 0) {
      cost[local_78] = (float)local_20 + 2.0;
    }
    else {
      uVar1 = CONCAT44(0,histogram[local_78]);
      if (uVar1 < 0x100) {
        local_30 = (double)kLog2Table[uVar1];
      }
      else {
        auVar4._8_4_ = 0;
        auVar4._0_8_ = uVar1;
        auVar4._12_4_ = 0x45300000;
        local_30 = log2((auVar4._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,histogram[local_78]) - 4503599627370496.0));
      }
      cost[local_78] = (float)local_10 - (float)local_30;
      if (cost[local_78] <= 1.0 && cost[local_78] != 1.0) {
        cost[local_78] = 1.0;
      }
    }
  }
  return;
}

Assistant:

static void SetCost(const uint32_t* histogram, size_t histogram_size,
                    BROTLI_BOOL literal_histogram, float* cost) {
  size_t sum = 0;
  size_t missing_symbol_sum;
  float log2sum;
  float missing_symbol_cost;
  size_t i;
  for (i = 0; i < histogram_size; i++) {
    sum += histogram[i];
  }
  log2sum = (float)FastLog2(sum);
  missing_symbol_sum = sum;
  if (!literal_histogram) {
    for (i = 0; i < histogram_size; i++) {
      if (histogram[i] == 0) missing_symbol_sum++;
    }
  }
  missing_symbol_cost = (float)FastLog2(missing_symbol_sum) + 2;
  for (i = 0; i < histogram_size; i++) {
    if (histogram[i] == 0) {
      cost[i] = missing_symbol_cost;
      continue;
    }

    /* Shannon bits for this symbol. */
    cost[i] = log2sum - (float)FastLog2(histogram[i]);

    /* Cannot be coded with less than 1 bit */
    if (cost[i] < 1) cost[i] = 1;
  }
}